

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeMoveto(BtCursor *pCur,void *pKey,i64 nKey,int bias,int *pRes)

{
  KeyInfo *pKeyInfo;
  int iVar1;
  UnpackedRecord *p;
  
  if (pKey != (void *)0x0) {
    pKeyInfo = pCur->pKeyInfo;
    p = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if (p == (UnpackedRecord *)0x0) {
      iVar1 = 7;
    }
    else {
      sqlite3VdbeRecordUnpack(pKeyInfo,(int)nKey,pKey,p);
      if ((p->nField == 0) || (pKeyInfo->nAllField < p->nField)) {
        iVar1 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x112d9,
                    "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
      }
      else {
        iVar1 = sqlite3BtreeIndexMoveto(pCur,p,pRes);
      }
      sqlite3DbFreeNN(pCur->pKeyInfo->db,p);
    }
    return iVar1;
  }
  iVar1 = sqlite3BtreeTableMoveto(pCur,nKey,bias,pRes);
  return iVar1;
}

Assistant:

static int btreeMoveto(
  BtCursor *pCur,     /* Cursor open on the btree to be searched */
  const void *pKey,   /* Packed key if the btree is an index */
  i64 nKey,           /* Integer key for tables.  Size of pKey for indices */
  int bias,           /* Bias search to the high end */
  int *pRes           /* Write search results here */
){
  int rc;                    /* Status code */
  UnpackedRecord *pIdxKey;   /* Unpacked index key */

  if( pKey ){
    KeyInfo *pKeyInfo = pCur->pKeyInfo;
    assert( nKey==(i64)(int)nKey );
    pIdxKey = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if( pIdxKey==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3VdbeRecordUnpack(pKeyInfo, (int)nKey, pKey, pIdxKey);
    if( pIdxKey->nField==0 || pIdxKey->nField>pKeyInfo->nAllField ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = sqlite3BtreeIndexMoveto(pCur, pIdxKey, pRes);
    }
    sqlite3DbFree(pCur->pKeyInfo->db, pIdxKey);
  }else{
    pIdxKey = 0;
    rc = sqlite3BtreeTableMoveto(pCur, nKey, bias, pRes);
  }
  return rc;
}